

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O0

void __thiscall miniros::MasterLink::update(MasterLink *this,string *key,RpcValue *v)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  scoped_lock<std::mutex> lock;
  bool enabled;
  string clean_key;
  char *in_stack_fffffffffffffee8;
  key_type *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  LogLocation *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  void *logger_handle;
  undefined4 in_stack_ffffffffffffff20;
  Level LVar2;
  undefined4 in_stack_ffffffffffffff24;
  key_type *in_stack_ffffffffffffff28;
  _Self in_stack_ffffffffffffff38;
  _Self local_c0 [2];
  undefined1 local_aa;
  allocator<char> local_a9;
  string *in_stack_ffffffffffffff58;
  MasterLink *in_stack_ffffffffffffff60;
  string local_88 [32];
  string local_68 [48];
  string local_38 [56];
  
  LVar2 = (Level)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  if (*(long *)in_RDI != 0) {
    names::clean((string *)in_stack_ffffffffffffff38._M_node);
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((update::loc.initialized_ ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffff28 = (key_type *)&local_a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RDI,(char *)in_stack_ffffffffffffff28,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      std::operator+(in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0);
      std::operator+(in_stack_fffffffffffffef8,(char *)in_stack_fffffffffffffef0);
      console::initializeLogLocation
                ((LogLocation *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18,LVar2);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
      std::allocator<char>::~allocator(&local_a9);
    }
    if (update::loc.level_ != Debug) {
      console::setLogLocationLevel
                ((LogLocation *)in_stack_fffffffffffffef0,
                 (Level)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      console::checkLogLocationEnabled(in_stack_ffffffffffffff00);
    }
    local_aa = (update::loc.logger_enabled_ & 1U) != 0;
    if ((bool)local_aa) {
      logger_handle = update::loc.logger_;
      LVar2 = update::loc.level_;
      in_stack_fffffffffffffef0 = (key_type *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffee8 = "Received parameter update for key [%s]";
      console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)LVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                     ,0x3cb,
                     "void miniros::MasterLink::update(const std::string &, const RpcValue &)");
    }
    std::scoped_lock<std::mutex>::scoped_lock
              ((scoped_lock<std::mutex> *)in_stack_fffffffffffffef0,
               (mutex_type *)in_stack_fffffffffffffee8);
    local_c0[0]._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffee8);
    bVar1 = std::operator!=(local_c0,(_Self *)&stack0xffffffffffffff38);
    if (bVar1) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                    *)in_RDI,in_stack_ffffffffffffff28);
      XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)in_RDI,(XmlRpcValue *)in_stack_ffffffffffffff28)
      ;
    }
    invalidateParentParams(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x45e524);
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void MasterLink::update(const std::string& key, const RpcValue& v)
{
  if (!internal_)
    return;
  std::string clean_key = names::clean(key);
  MINIROS_DEBUG_NAMED("cached_parameters", "Received parameter update for key [%s]", clean_key.c_str());

  std::scoped_lock<std::mutex> lock(internal_->params_mutex);

  if (internal_->subscribed_params.find(clean_key) != internal_->subscribed_params.end()) {
    internal_->params[clean_key] = v;
  }
  invalidateParentParams(clean_key);
}